

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error
ft_stroker_subpath_start(PVG_FT_Stroker stroker,PVG_FT_Angle start_angle,PVG_FT_Fixed line_length)

{
  PVG_FT_Error PVar1;
  PVG_FT_Vector delta;
  PVG_FT_Vector local_48;
  PVG_FT_Vector local_38;
  
  PVG_FT_Vector_From_Polar(&local_38,stroker->radius,start_angle + 0x5a0000);
  local_48.x = (stroker->center).x + local_38.x;
  local_48.y = (stroker->center).y + local_38.y;
  ft_stroke_border_moveto(stroker->borders,&local_48);
  local_48.x = (stroker->center).x - local_38.x;
  local_48.y = (stroker->center).y - local_38.y;
  PVar1 = ft_stroke_border_moveto(stroker->borders + 1,&local_48);
  stroker->subpath_angle = start_angle;
  stroker->first_point = '\0';
  stroker->subpath_line_length = line_length;
  return PVar1;
}

Assistant:

static PVG_FT_Error ft_stroker_subpath_start(PVG_FT_Stroker stroker,
                                            PVG_FT_Angle   start_angle,
                                            PVG_FT_Fixed   line_length)
{
    PVG_FT_Vector       delta;
    PVG_FT_Vector       point;
    PVG_FT_Error        error;
    PVG_FT_StrokeBorder border;

    PVG_FT_Vector_From_Polar(&delta, stroker->radius,
                            start_angle + PVG_FT_ANGLE_PI2);

    point.x = stroker->center.x + delta.x;
    point.y = stroker->center.y + delta.y;

    border = stroker->borders;
    error = ft_stroke_border_moveto(border, &point);
    if (error) goto Exit;

    point.x = stroker->center.x - delta.x;
    point.y = stroker->center.y - delta.y;

    border++;
    error = ft_stroke_border_moveto(border, &point);

    /* save angle, position, and line length for last join */
    /* (line_length is zero for curves)                    */
    stroker->subpath_angle = start_angle;
    stroker->first_point = FALSE;
    stroker->subpath_line_length = line_length;

Exit:
    return error;
}